

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,AtomicRmwExpr *expr)

{
  Module *pMVar1;
  Memory *memory_00;
  Enum EVar2;
  Index IVar3;
  const_reference ppMVar4;
  Newline local_d9;
  Type local_d8;
  StackVar local_d0;
  Type local_c4;
  StackVar local_bc;
  ExternalInstancePtr local_b0;
  Type local_9c;
  StackVar local_94;
  Type local_88;
  Type result_type;
  string local_60;
  Memory *local_40;
  Memory *memory;
  string func;
  AtomicRmwExpr *expr_local;
  CWriter *this_local;
  
  func.field_2._8_8_ = expr;
  std::__cxx11::string::string((string *)&memory);
  EVar2 = Opcode::operator_cast_to_Enum((Opcode *)(func.field_2._8_8_ + 0x88));
  switch(EVar2) {
  case I32AtomicRmwAdd:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw_add");
    break;
  case I64AtomicRmwAdd:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw_add");
    break;
  case I32AtomicRmw8AddU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw8_add_u");
    break;
  case I32AtomicRmw16AddU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw16_add_u");
    break;
  case I64AtomicRmw8AddU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw8_add_u");
    break;
  case I64AtomicRmw16AddU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw16_add_u");
    break;
  case I64AtomicRmw32AddU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw32_add_u");
    break;
  case I32AtomicRmwSub:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw_sub");
    break;
  case I64AtomicRmwSub:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw_sub");
    break;
  case I32AtomicRmw8SubU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw8_sub_u");
    break;
  case I32AtomicRmw16SubU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw16_sub_u");
    break;
  case I64AtomicRmw8SubU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw8_sub_u");
    break;
  case I64AtomicRmw16SubU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw16_sub_u");
    break;
  case I64AtomicRmw32SubU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw32_sub_u");
    break;
  case I32AtomicRmwAnd:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw_and");
    break;
  case I64AtomicRmwAnd:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw_and");
    break;
  case I32AtomicRmw8AndU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw8_and_u");
    break;
  case I32AtomicRmw16AndU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw16_and_u");
    break;
  case I64AtomicRmw8AndU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw8_and_u");
    break;
  case I64AtomicRmw16AndU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw16_and_u");
    break;
  case I64AtomicRmw32AndU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw32_and_u");
    break;
  case I32AtomicRmwOr:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw_or");
    break;
  case I64AtomicRmwOr:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw_or");
    break;
  case I32AtomicRmw8OrU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw8_or_u");
    break;
  case I32AtomicRmw16OrU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw16_or_u");
    break;
  case I64AtomicRmw8OrU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw8_or_u");
    break;
  case I64AtomicRmw16OrU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw16_or_u");
    break;
  case I64AtomicRmw32OrU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw32_or_u");
    break;
  case I32AtomicRmwXor:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw_xor");
    break;
  case I64AtomicRmwXor:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw_xor");
    break;
  case I32AtomicRmw8XorU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw8_xor_u");
    break;
  case I32AtomicRmw16XorU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw16_xor_u");
    break;
  case I64AtomicRmw8XorU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw8_xor_u");
    break;
  case I64AtomicRmw16XorU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw16_xor_u");
    break;
  case I64AtomicRmw32XorU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw32_xor_u");
    break;
  case I32AtomicRmwXchg:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw_xchg");
    break;
  case I64AtomicRmwXchg:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw_xchg");
    break;
  case I32AtomicRmw8XchgU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw8_xchg_u");
    break;
  case I32AtomicRmw16XchgU:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_rmw16_xchg_u");
    break;
  case I64AtomicRmw8XchgU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw8_xchg_u");
    break;
  case I64AtomicRmw16XchgU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw16_xchg_u");
    break;
  case I64AtomicRmw32XchgU:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_rmw32_xchg_u");
    break;
  default:
    abort();
  }
  pMVar1 = this->module_;
  IVar3 = Module::GetMemoryIndex(this->module_,(Var *)(func.field_2._8_8_ + 0x40));
  ppMVar4 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                      (&pMVar1->memories,(ulong)IVar3);
  memory_00 = *ppMVar4;
  local_40 = memory_00;
  std::__cxx11::string::string((string *)&result_type,(string *)&memory);
  GetMemoryAPIString(&local_60,memory_00,(string *)&result_type);
  std::__cxx11::string::operator=((string *)&memory,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&result_type);
  local_9c = Opcode::GetResultType((Opcode *)(func.field_2._8_8_ + 0x88));
  local_88 = local_9c;
  StackVar::StackVar(&local_94,1,local_9c);
  ExternalInstancePtr::GlobalName(&local_b0,Memory,&local_40->name);
  Type::Type(&local_c4,Any);
  StackVar::StackVar(&local_bc,1,local_c4);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            ((CWriter *)this,&local_94,(char (*) [4])0x239347,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&memory,
             (char (*) [2])0x239ca8,&local_b0,(char (*) [9])", (u64)(",&local_bc,
             (char (*) [2])0x238c91);
  if (*(long *)(func.field_2._8_8_ + 0x98) != 0) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[4],unsigned_long_const&>
              ((CWriter *)this,(char (*) [4])" + ",(unsigned_long *)(func.field_2._8_8_ + 0x98));
  }
  Type::Type(&local_d8,Any);
  StackVar::StackVar(&local_d0,0,local_d8);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x23cd10,&local_d0,(char (*) [3])0x239d95,&local_d9);
  DropTypes(this,2);
  PushType(this,local_88);
  std::__cxx11::string::~string((string *)&memory);
  return;
}

Assistant:

void CWriter::Write(const AtomicRmwExpr& expr) {
  std::string func;
  // clang-format off
  switch (expr.opcode) {
    case Opcode::I32AtomicRmwAdd: func = "i32_atomic_rmw_add"; break;
    case Opcode::I64AtomicRmwAdd: func = "i64_atomic_rmw_add"; break;
    case Opcode::I32AtomicRmw8AddU: func = "i32_atomic_rmw8_add_u"; break;
    case Opcode::I32AtomicRmw16AddU: func = "i32_atomic_rmw16_add_u"; break;
    case Opcode::I64AtomicRmw8AddU: func = "i64_atomic_rmw8_add_u"; break;
    case Opcode::I64AtomicRmw16AddU: func = "i64_atomic_rmw16_add_u"; break;
    case Opcode::I64AtomicRmw32AddU: func = "i64_atomic_rmw32_add_u"; break;
    case Opcode::I32AtomicRmwSub: func = "i32_atomic_rmw_sub"; break;
    case Opcode::I64AtomicRmwSub: func = "i64_atomic_rmw_sub"; break;
    case Opcode::I32AtomicRmw8SubU: func = "i32_atomic_rmw8_sub_u"; break;
    case Opcode::I32AtomicRmw16SubU: func = "i32_atomic_rmw16_sub_u"; break;
    case Opcode::I64AtomicRmw8SubU: func = "i64_atomic_rmw8_sub_u"; break;
    case Opcode::I64AtomicRmw16SubU: func = "i64_atomic_rmw16_sub_u"; break;
    case Opcode::I64AtomicRmw32SubU: func = "i64_atomic_rmw32_sub_u"; break;
    case Opcode::I32AtomicRmwAnd: func = "i32_atomic_rmw_and"; break;
    case Opcode::I64AtomicRmwAnd: func = "i64_atomic_rmw_and"; break;
    case Opcode::I32AtomicRmw8AndU: func = "i32_atomic_rmw8_and_u"; break;
    case Opcode::I32AtomicRmw16AndU: func = "i32_atomic_rmw16_and_u"; break;
    case Opcode::I64AtomicRmw8AndU: func = "i64_atomic_rmw8_and_u"; break;
    case Opcode::I64AtomicRmw16AndU: func = "i64_atomic_rmw16_and_u"; break;
    case Opcode::I64AtomicRmw32AndU: func = "i64_atomic_rmw32_and_u"; break;
    case Opcode::I32AtomicRmwOr: func = "i32_atomic_rmw_or"; break;
    case Opcode::I64AtomicRmwOr: func = "i64_atomic_rmw_or"; break;
    case Opcode::I32AtomicRmw8OrU: func = "i32_atomic_rmw8_or_u"; break;
    case Opcode::I32AtomicRmw16OrU: func = "i32_atomic_rmw16_or_u"; break;
    case Opcode::I64AtomicRmw8OrU: func = "i64_atomic_rmw8_or_u"; break;
    case Opcode::I64AtomicRmw16OrU: func = "i64_atomic_rmw16_or_u"; break;
    case Opcode::I64AtomicRmw32OrU: func = "i64_atomic_rmw32_or_u"; break;
    case Opcode::I32AtomicRmwXor: func = "i32_atomic_rmw_xor"; break;
    case Opcode::I64AtomicRmwXor: func = "i64_atomic_rmw_xor"; break;
    case Opcode::I32AtomicRmw8XorU: func = "i32_atomic_rmw8_xor_u"; break;
    case Opcode::I32AtomicRmw16XorU: func = "i32_atomic_rmw16_xor_u"; break;
    case Opcode::I64AtomicRmw8XorU: func = "i64_atomic_rmw8_xor_u"; break;
    case Opcode::I64AtomicRmw16XorU: func = "i64_atomic_rmw16_xor_u"; break;
    case Opcode::I64AtomicRmw32XorU: func = "i64_atomic_rmw32_xor_u"; break;
    case Opcode::I32AtomicRmwXchg: func = "i32_atomic_rmw_xchg"; break;
    case Opcode::I64AtomicRmwXchg: func = "i64_atomic_rmw_xchg"; break;
    case Opcode::I32AtomicRmw8XchgU: func = "i32_atomic_rmw8_xchg_u"; break;
    case Opcode::I32AtomicRmw16XchgU: func = "i32_atomic_rmw16_xchg_u"; break;
    case Opcode::I64AtomicRmw8XchgU: func = "i64_atomic_rmw8_xchg_u"; break;
    case Opcode::I64AtomicRmw16XchgU: func = "i64_atomic_rmw16_xchg_u"; break;
    case Opcode::I64AtomicRmw32XchgU: func = "i64_atomic_rmw32_xchg_u"; break;
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on

  Memory* memory = module_->memories[module_->GetMemoryIndex(expr.memidx)];
  func = GetMemoryAPIString(*memory, func);

  Type result_type = expr.opcode.GetResultType();

  Write(StackVar(1, result_type), " = ", func, "(",
        ExternalInstancePtr(ModuleFieldType::Memory, memory->name), ", (u64)(",
        StackVar(1), ")");
  if (expr.offset != 0)
    Write(" + ", expr.offset);
  Write(", ", StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}